

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

ssh_compressor * zlib_compress_init(void)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long lVar4;
  
  puVar1 = (undefined8 *)safemalloc(1,0x28,0);
  pvVar2 = safemalloc(1,0x38ffc,0);
  if (pvVar2 != (void *)0x0) {
    *puVar1 = pvVar2;
    for (lVar4 = 4; lVar4 != 0x30004; lVar4 = lVar4 + 6) {
      *(undefined2 *)((long)pvVar2 + lVar4) = 0xffff;
      *(undefined4 *)((long)pvVar2 + lVar4 + -4) = 0xffffffff;
    }
    for (lVar4 = 0; lVar4 != 0x7f7; lVar4 = lVar4 + 1) {
      *(undefined2 *)((long)pvVar2 + lVar4 * 2 + 0x38004) = 0xffff;
    }
    *(undefined4 *)((long)pvVar2 + 0x38000) = 0;
    *(undefined4 *)((long)pvVar2 + 0x38ff8) = 0;
  }
  puVar1[4] = &ssh_zlib;
  puVar1[2] = zlib_literal;
  puVar1[3] = zlib_match;
  puVar3 = (undefined8 *)safemalloc(1,0x18,0);
  *(undefined4 *)(puVar3 + 2) = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  *(undefined1 *)((long)puVar3 + 0x14) = 1;
  puVar1[1] = puVar3;
  return (ssh_compressor *)(puVar1 + 4);
}

Assistant:

ssh_compressor *zlib_compress_init(void)
{
    struct Outbuf *out;
    struct ssh_zlib_compressor *comp = snew(struct ssh_zlib_compressor);

    lz77_init(&comp->ectx);
    comp->sc.vt = &ssh_zlib;
    comp->ectx.literal = zlib_literal;
    comp->ectx.match = zlib_match;

    out = snew(struct Outbuf);
    out->outbuf = NULL;
    out->outbits = out->noutbits = 0;
    out->firstblock = true;
    comp->ectx.userdata = out;

    return &comp->sc;
}